

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

uint32 __thiscall google::anon_unknown_8::LogFileObject::LogSize(LogFileObject *this)

{
  uint32 uVar1;
  
  std::mutex::lock(&this->mutex_);
  uVar1 = this->file_length_;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return uVar1;
}

Assistant:

uint32 LogSize() override {
    std::lock_guard<std::mutex> l{mutex_};
    return file_length_;
  }